

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

ScopedElement * __thiscall
doctest::anon_unknown_14::XmlWriter::ScopedElement::writeText
          (ScopedElement *this,string *text,bool indent)

{
  ScopedElement *in_RDI;
  string *in_stack_00000028;
  XmlWriter *in_stack_00000030;
  
  XmlWriter::writeText(in_stack_00000030,in_stack_00000028,this._7_1_);
  return in_RDI;
}

Assistant:

XmlWriter::ScopedElement& XmlWriter::ScopedElement::writeText( std::string const& text, bool indent ) {
        m_writer->writeText( text, indent );
        return *this;
    }